

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_scheduler.cpp
# Opt level: O0

void async::detail::thread_task_loop
               (threadpool_data *impl,size_t thread_id,task_wait_handle wait_task)

{
  size_t __i;
  task_base *ptVar1;
  bool bVar2;
  uint uVar3;
  type pptVar4;
  type __b_00;
  EVP_PKEY_CTX *ctx;
  void *__stat_loc;
  task_base *local_158;
  size_t i;
  int events;
  size_t num_waiters_val;
  undefined1 local_138 [8];
  task_run_handle t_2;
  unique_lock<std::mutex> locked;
  task_run_handle t_1;
  task_run_handle t;
  undefined1 local_100 [8];
  task_wait_event event;
  bool added_continuation;
  thread_data_t *current_thread;
  size_t thread_id_local;
  threadpool_data *impl_local;
  task_wait_handle wait_task_local;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_3;
  memory_order __b_1;
  
  impl_local = (threadpool_data *)wait_task.handle;
  aligned_array<async::detail::thread_data_t,_64UL>::operator[](&impl->thread_data,thread_id);
  event._95_1_ = 0;
  task_wait_event::task_wait_event((task_wait_event *)local_100);
LAB_0010b618:
  do {
    do {
      bVar2 = task_wait_handle::operator_cast_to_bool((task_wait_handle *)&impl_local);
      if (bVar2) {
        if ((event._95_1_ & 1) == 0) {
          bVar2 = task_wait_handle::ready((task_wait_handle *)&impl_local);
          if (bVar2) goto LAB_0010bd30;
        }
        else {
          bVar2 = task_wait_event::try_wait((task_wait_event *)local_100,1);
          if (bVar2) goto LAB_0010bd30;
        }
      }
      work_steal_queue::pop((work_steal_queue *)&t_1);
      bVar2 = task_run_handle::operator_cast_to_bool(&t_1);
      if (bVar2) {
        task_run_handle::run(&t_1);
      }
      task_run_handle::~task_run_handle(&t_1);
    } while (bVar2);
    do {
      steal_task((detail *)&locked._M_owns,impl,thread_id);
      bVar2 = task_run_handle::operator_cast_to_bool((task_run_handle *)&locked._M_owns);
      if (bVar2) {
        task_run_handle::run((task_run_handle *)&locked._M_owns);
        t.handle.p._0_4_ = 5;
      }
      else {
        t.handle.p._0_4_ = 0;
      }
      task_run_handle::~task_run_handle((task_run_handle *)&locked._M_owns);
      if ((int)t.handle.p != 0) goto LAB_0010b618;
      std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&t_2,&impl->lock);
      ctx = (EVP_PKEY_CTX *)&impl->public_queue;
      fifo_queue::pop((fifo_queue *)local_138);
      bVar2 = task_run_handle::operator_cast_to_bool((task_run_handle *)local_138);
      if (bVar2) {
        std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&t_2);
        task_run_handle::run((task_run_handle *)local_138);
        t.handle.p._0_4_ = 5;
      }
      else {
        t.handle.p._0_4_ = 0;
      }
      task_run_handle::~task_run_handle((task_run_handle *)local_138);
      if ((int)t.handle.p == 0) {
        bVar2 = task_wait_handle::operator_cast_to_bool((task_wait_handle *)&impl_local);
        if ((bVar2) || ((impl->shutdown & 1U) == 0)) {
          task_wait_event::init((task_wait_event *)local_100,ctx);
          bVar2 = task_wait_handle::operator_cast_to_bool((task_wait_handle *)&impl_local);
          if ((bVar2) && ((event._95_1_ & 1) == 0)) {
            num_waiters_val = (size_t)local_100;
            task_wait_handle::
            on_finish<async::detail::thread_task_loop(async::detail::threadpool_data*,unsigned_long,async::task_wait_handle)::__0>
                      ((task_wait_handle *)&impl_local,
                       (anon_class_8_1_a7e061ba_for_func *)&num_waiters_val);
            event._95_1_ = 1;
          }
          std::operator&(memory_order_relaxed,__memory_order_mask);
          __i = (impl->num_waiters).super___atomic_base<unsigned_long>._M_i;
          pptVar4 = std::
                    unique_ptr<async::detail::task_wait_event_*[],_std::default_delete<async::detail::task_wait_event_*[]>_>
                    ::operator[](&impl->waiters,__i);
          *pptVar4 = (task_wait_event *)local_100;
          __stat_loc = (void *)0xffff;
          std::operator&(memory_order_relaxed,__memory_order_mask);
          (impl->num_waiters).super___atomic_base<unsigned_long>._M_i = __i + 1;
          std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&t_2);
          uVar3 = task_wait_event::wait((task_wait_event *)local_100,__stat_loc);
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&t_2);
          std::operator&(memory_order_relaxed,__memory_order_mask);
          ptVar1 = (task_base *)(impl->num_waiters).super___atomic_base<unsigned_long>._M_i;
          wait_task_local.handle = ptVar1;
          for (local_158 = (task_base *)0x0; local_158 < ptVar1;
              local_158 = (task_base *)
                          ((long)&(local_158->
                                  super_ref_count_base<async::detail::task_base,_async::detail::task_base_deleter>
                                  ).ref_count.super___atomic_base<unsigned_long>._M_i + 1)) {
            pptVar4 = std::
                      unique_ptr<async::detail::task_wait_event_*[],_std::default_delete<async::detail::task_wait_event_*[]>_>
                      ::operator[](&impl->waiters,(size_t)local_158);
            if (*pptVar4 == (task_wait_event *)local_100) {
              if (local_158 != (task_base *)&ptVar1[-1].field_0x3f) {
                pptVar4 = std::
                          unique_ptr<async::detail::task_wait_event_*[],_std::default_delete<async::detail::task_wait_event_*[]>_>
                          ::operator[](&impl->waiters,(size_t)local_158);
                __b_00 = std::
                         unique_ptr<async::detail::task_wait_event_*[],_std::default_delete<async::detail::task_wait_event_*[]>_>
                         ::operator[](&impl->waiters,(size_t)&ptVar1[-1].field_0x3f);
                std::swap<async::detail::task_wait_event*>(pptVar4,__b_00);
              }
              std::operator&(memory_order_relaxed,__memory_order_mask);
              (impl->num_waiters).super___atomic_base<unsigned_long>._M_i =
                   (__int_type)&ptVar1[-1].field_0x3f;
              break;
            }
          }
          bVar2 = task_wait_handle::operator_cast_to_bool((task_wait_handle *)&impl_local);
          if ((bVar2) && ((uVar3 & 1) != 0)) {
            t.handle.p._0_4_ = 1;
          }
          else {
            t.handle.p._0_4_ = 0;
          }
        }
        else {
          t.handle.p._0_4_ = 1;
        }
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&t_2);
    } while ((int)t.handle.p == 0);
  } while ((int)t.handle.p == 5);
LAB_0010bd30:
  task_wait_event::~task_wait_event((task_wait_event *)local_100);
  return;
}

Assistant:

static void thread_task_loop(threadpool_data* impl, std::size_t thread_id, task_wait_handle wait_task)
{
	// Get our thread's data
	thread_data_t& current_thread = impl->thread_data[thread_id];

	// Flag indicating if we have added a continuation to the task
	bool added_continuation = false;

	// Event to wait on
	task_wait_event event;

	// Loop while waiting for the task to complete
	while (true) {
		// Check if the task has finished. If we have added a continuation, we
		// need to make sure the event has been signaled, otherwise the other
		// thread may try to signal it after we have freed it.
		if (wait_task && (added_continuation ? event.try_wait(wait_type::task_finished) : wait_task.ready()))
			return;

		// Try to get a task from the local queue
		if (task_run_handle t = current_thread.queue.pop()) {
			t.run();
			continue;
		}

		// Stealing loop
		while (true) {
			// Try to steal a task
			if (task_run_handle t = steal_task(impl, thread_id)) {
				t.run();
				break;
			}

			// Try to fetch from the public queue
			std::unique_lock<std::mutex> locked(impl->lock);
			if (task_run_handle t = impl->public_queue.pop()) {
				// Don't hold the lock while running the task
				locked.unlock();
				t.run();
				break;
			}

			// If shutting down and we don't have a task to wait for, return.
			if (!wait_task && impl->shutdown) {
#ifdef BROKEN_JOIN_IN_DESTRUCTOR
				// Notify once all worker threads have exited
				if (--impl->shutdown_num_threads == 0)
					impl->shutdown_complete_event.notify_one();
#endif
				return;
			}

			// Initialize the event object
			event.init();

			// No tasks found, so sleep until something happens.
			// If a continuation has not been added yet, add it.
			if (wait_task && !added_continuation) {
				// Create a continuation for the task we are waiting for
				wait_task.on_finish([&event] {
					// Signal the thread's event
					event.signal(wait_type::task_finished);
				});
				added_continuation = true;
			}

			// Add our thread to the list of waiting threads
			size_t num_waiters_val = impl->num_waiters.load(std::memory_order_relaxed);
			impl->waiters[num_waiters_val] = &event;
			impl->num_waiters.store(num_waiters_val + 1, std::memory_order_relaxed);

			// Wait for our event to be signaled when a task is scheduled or
			// the task we are waiting for has completed.
			locked.unlock();
			int events = event.wait();
			locked.lock();

			// Remove our thread from the list of waiting threads
			num_waiters_val = impl->num_waiters.load(std::memory_order_relaxed);
			for (std::size_t i = 0; i < num_waiters_val; i++) {
				if (impl->waiters[i] == &event) {
					if (i != num_waiters_val - 1)
						std::swap(impl->waiters[i], impl->waiters[num_waiters_val - 1]);
					impl->num_waiters.store(num_waiters_val - 1, std::memory_order_relaxed);
					break;
				}
			}

			// Check again if the task has finished. We have added a
			// continuation at this point, so we need to check that the
			// continuation has finished signaling the event.
			if (wait_task && (events & wait_type::task_finished))
				return;
		}
	}
}